

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2skini.cpp
# Opt level: O2

void printMidiAsSkini(MidiFile *midifile)

{
  int iVar1;
  int iVar2;
  MidiEvent *mfevent;
  int anIndex;
  int oldticks;
  double tempo;
  double curtime;
  MidiEvent event;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  MidiEvent local_68;
  
  iVar1 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  local_70 = 0.0;
  local_80 = 120.0;
  local_78 = (double)iVar1;
  anIndex = 0;
  local_88 = 0.0;
  iVar1 = 0;
  while( true ) {
    iVar2 = smf::MidiFile::getNumEvents(midifile,0);
    if (iVar2 <= anIndex) break;
    mfevent = smf::MidiFile::getEvent(midifile,0,anIndex);
    smf::MidiEvent::MidiEvent(&local_68,mfevent);
    iVar2 = local_68.tick;
    if (anIndex != 0) {
      local_88 = local_88 + (((double)(local_68.tick - iVar1) * 60.0) / local_80) / local_78;
      local_70 = local_88;
    }
    processEvent(&local_68,&local_80,&local_70);
    smf::MidiEvent::~MidiEvent(&local_68);
    anIndex = anIndex + 1;
    iVar1 = iVar2;
  }
  return;
}

Assistant:

void printMidiAsSkini(MidiFile& midifile) {
   int       tpq      = midifile.getTicksPerQuarterNote();
   int       ticks    = 0;     // absolute ticks of current event
   double    tempo    = 120.0; // time units will be in seconds
   double    curtime  = 0.0;   // current time in seconds
   int       i;

   for (i=0; i<midifile.getNumEvents(0); i++) {
      int oldticks = ticks;
      MidiEvent event = midifile.getEvent(0, i);
      ticks = event.tick;
      if (i>0) {
         curtime += (ticks - oldticks) * 60.0 / tempo / tpq;
      }
      processEvent(event, tempo, curtime);
   }
}